

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O1

TCompareResult __thiscall
Refal2::CArbitraryInteger::Compare(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  pointer puVar1;
  TCompareResult TVar2;
  pointer puVar3;
  
  puVar1 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar1 != puVar3 && (puVar3 = puVar3 + -1, *puVar3 == 0))) {
    (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  puVar1 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while ((puVar1 != puVar3 && (puVar3 = puVar3 + -1, *puVar3 == 0))) {
    (operand->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  if ((this->isNegative == operand->isNegative) &&
     (TVar2 = compare(this,operand), TVar2 != CR_Great)) {
    if (TVar2 == CR_Equal) {
      return CR_Equal;
    }
    TVar2 = (uint)this->isNegative + CR_Less;
  }
  else {
    TVar2 = -(uint)this->isNegative;
  }
  return TVar2 | CR_Great;
}

Assistant:

CArbitraryInteger::TCompareResult CArbitraryInteger::Compare(
	const CArbitraryInteger& operand ) const
{
	const_cast<CArbitraryInteger&>( *this ).removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		switch( compare( operand ) ) {
			case CR_Less:
				return ( IsNegative() ? CR_Great : CR_Less );
			case CR_Equal:
				return CR_Equal;
			case CR_Great:
				break;
			default:
				assert( false );
				break;
		}
	}
	return ( IsNegative() ? CR_Less : CR_Great );
}